

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O1

bool __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,weighted_vec_array *weighted_vecs,
          uint max_clusters,vector<crnlib::vector<unsigned_int>_> *cluster_indices,
          progress_callback_func pProgress_callback,void *pProgress_callback_data)

{
  vector_clusterizer *this_00;
  bool bVar1;
  task_pool *this_01;
  vector<unsigned_int> *pvVar2;
  void *pvVar3;
  long lVar4;
  uint *puVar5;
  crn_thread_id_t cVar6;
  long lVar7;
  executable_task *pObj;
  ulong uVar8;
  uint min_new_capacity;
  uint i;
  uint64 data;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  int *pData_ptr;
  uint i_1;
  uint uVar13;
  vector<unsigned_int> primary_indices;
  vector<unsigned_int> indices [6];
  create_clusters_task_state task_state [4];
  vector<unsigned_int> local_148;
  vector<unsigned_int> local_138;
  vector<unsigned_int> local_128;
  vector<unsigned_int> local_118;
  vector<unsigned_int> local_108;
  vector<unsigned_int> local_f8;
  vector<unsigned_int> local_e8;
  int local_d8 [2];
  long local_d0 [2];
  uint auStack_c0 [34];
  int local_38 [2];
  
  cVar6 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar6;
  this->m_canceled = false;
  this->m_pProgress_callback = pProgress_callback;
  this->m_pProgress_callback_data = pProgress_callback_data;
  if (max_clusters < 0x80) {
    this_00 = this->m_clusterizers;
    clusterizer<crnlib::vec<16U,_float>_>::clear(this_00);
    vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::reserve
              (&this_00->m_training_vecs,weighted_vecs->m_size);
    if (weighted_vecs->m_size != 0) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                  (this_00,(vec<16U,_float> *)((long)(weighted_vecs->m_p->m_vec).m_s + lVar7),
                   *(uint *)((long)(&weighted_vecs->m_p->m_vec + 1) + lVar7));
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x44;
      } while (uVar8 < weighted_vecs->m_size);
    }
    clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
              (this_00,max_clusters,generate_codebook_progress_callback,this,false);
    clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
              (this_00,this->m_clusterizers[0].m_codebook.m_size,cluster_indices);
  }
  else {
    uVar10 = weighted_vecs->m_size;
    local_148.m_p = (uint *)0x0;
    local_148.m_size = 0;
    local_148.m_capacity = 0;
    if (uVar10 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,uVar10,uVar10 == 1,4,(object_mover)0x0,false);
      memset(local_148.m_p + (local_148._8_8_ & 0xffffffff),0,
             (ulong)(uVar10 - local_148.m_size) << 2);
      local_148.m_size = uVar10;
    }
    if (weighted_vecs->m_size != 0) {
      uVar8 = 0;
      do {
        local_148.m_p[uVar8] = (uint)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar8 < weighted_vecs->m_size);
    }
    local_e8.m_p = (uint *)0x0;
    local_e8.m_size = 0;
    local_e8.m_capacity = 0;
    local_f8.m_p = (uint *)0x0;
    local_f8.m_size = 0;
    local_f8.m_capacity = 0;
    local_108.m_p = (uint *)0x0;
    local_108.m_size = 0;
    local_108.m_capacity = 0;
    local_118.m_p = (uint *)0x0;
    local_118.m_size = 0;
    local_118.m_capacity = 0;
    local_128.m_p = (uint *)0x0;
    local_128.m_size = 0;
    local_128.m_capacity = 0;
    local_138.m_p = (uint *)0x0;
    local_138.m_size = 0;
    local_138.m_capacity = 0;
    compute_split(this,weighted_vecs,&local_148,&local_138,&local_128);
    compute_split(this,weighted_vecs,&local_138,&local_118,&local_108);
    compute_split(this,weighted_vecs,&local_128,&local_f8,&local_e8);
    lVar7 = 0;
    do {
      *(undefined8 *)((long)local_d0 + lVar7 + 8) = 0;
      *(undefined8 *)((long)auStack_c0 + lVar7) = 0;
      *(undefined8 *)((long)local_d8 + lVar7) = 0;
      *(undefined8 *)((long)local_d0 + lVar7) = 0;
      *(undefined4 *)((long)auStack_c0 + lVar7 + 8) = 0;
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0xa0);
    this->m_cluster_task_displayed_progress = false;
    uVar13 = 0;
    lVar7 = 0x28;
    do {
      uVar13 = (uVar13 + 1) - (uint)(*(int *)((long)&local_138.m_p + lVar7) == 0);
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x68);
    piVar12 = local_38;
    pData_ptr = local_d8;
    lVar7 = -0x40;
    data = 0;
    do {
      if (*(int *)((long)local_d0 + lVar7) != 0) {
        *(weighted_vec_array **)pData_ptr = weighted_vecs;
        *(long *)(pData_ptr + 2) = (long)local_d8 + lVar7;
        pData_ptr[8] = ((uVar13 >> 1) + max_clusters) / uVar13;
        this_01 = this->m_pTask_pool;
        pObj = (executable_task *)crnlib_malloc(0x28);
        pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce4f8;
        pObj[1]._vptr_executable_task = (_func_int **)this;
        pObj[2]._vptr_executable_task = (_func_int **)create_clusters_task;
        pObj[3]._vptr_executable_task = (_func_int **)0x0;
        *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
        task_pool::queue_task(this_01,pObj,data,pData_ptr);
      }
      data = data + 1;
      pData_ptr = pData_ptr + 10;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0);
    task_pool::join(this->m_pTask_pool);
    bVar1 = this->m_canceled;
    if (bVar1 == false) {
      uVar10 = 0;
      lVar7 = 0x18;
      do {
        uVar10 = uVar10 + *(int *)((long)local_d8 + lVar7);
        lVar7 = lVar7 + 0x28;
      } while (lVar7 != 0xb8);
      vector<crnlib::vector<unsigned_int>_>::reserve(cluster_indices,uVar10);
      uVar13 = cluster_indices->m_size;
      if ((ulong)uVar13 != 0) {
        pvVar2 = cluster_indices->m_p;
        lVar7 = 0;
        do {
          pvVar3 = *(void **)((long)&pvVar2->m_p + lVar7);
          if (pvVar3 != (void *)0x0) {
            crnlib_free(pvVar3);
          }
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar13 << 4 != lVar7);
        cluster_indices->m_size = 0;
      }
      lVar7 = 0;
      do {
        uVar13 = cluster_indices->m_size;
        uVar11 = auStack_c0[lVar7 * 10];
        if (uVar11 != 0) {
          min_new_capacity = uVar11 + uVar13;
          if (min_new_capacity < uVar13) {
            pvVar2 = cluster_indices->m_p;
            lVar9 = 0;
            do {
              pvVar3 = *(void **)((long)&pvVar2[min_new_capacity].m_p + lVar9);
              if (pvVar3 != (void *)0x0) {
                crnlib_free(pvVar3);
              }
              lVar9 = lVar9 + 0x10;
            } while ((ulong)-uVar11 << 4 != lVar9);
          }
          else {
            if (cluster_indices->m_capacity < min_new_capacity) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)cluster_indices,min_new_capacity,uVar11 == 1,0x10,
                         (object_mover)0x0,false);
            }
            uVar11 = cluster_indices->m_size;
            if (min_new_capacity != uVar11) {
              memset(cluster_indices->m_p + uVar11,0,(ulong)(min_new_capacity - uVar11) << 4);
            }
          }
          cluster_indices->m_size = min_new_capacity;
        }
        if (auStack_c0[lVar7 * 10] != 0) {
          lVar9 = 0xc;
          uVar8 = 0;
          do {
            uVar11 = (int)uVar8 + uVar13;
            pvVar2 = cluster_indices->m_p;
            lVar4 = local_d0[lVar7 * 5 + 1];
            puVar5 = pvVar2[uVar11].m_p;
            pvVar2[uVar11].m_p = *(uint **)(lVar4 + -0xc + lVar9);
            *(uint **)(lVar4 + -0xc + lVar9) = puVar5;
            uVar10 = pvVar2[uVar11].m_size;
            pvVar2[uVar11].m_size = *(uint *)(lVar4 + -4 + lVar9);
            *(uint *)(lVar4 + -4 + lVar9) = uVar10;
            uVar10 = pvVar2[uVar11].m_capacity;
            pvVar2[uVar11].m_capacity = *(uint *)(lVar4 + lVar9);
            *(uint *)(lVar4 + lVar9) = uVar10;
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar8 < auStack_c0[lVar7 * 10]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
    do {
      lVar7 = *(long *)(piVar12 + -6);
      if (lVar7 != 0) {
        uVar13 = piVar12[-4];
        if ((ulong)uVar13 != 0) {
          lVar9 = 0;
          do {
            pvVar3 = *(void **)(lVar7 + lVar9);
            if (pvVar3 != (void *)0x0) {
              crnlib_free(pvVar3);
            }
            lVar9 = lVar9 + 0x10;
          } while ((ulong)uVar13 << 4 != lVar9);
        }
        crnlib_free(*(void **)(piVar12 + -6));
      }
      piVar12 = piVar12 + -10;
    } while (piVar12 != local_d8);
    lVar7 = 0x60;
    do {
      pvVar3 = *(void **)((long)&local_148.m_p + lVar7);
      if (pvVar3 != (void *)0x0) {
        crnlib_free(pvVar3);
      }
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
    if (local_148.m_p != (uint *)0x0) {
      crnlib_free(local_148.m_p);
    }
    if (bVar1 != false) {
      return false;
    }
  }
  return (bool)(this->m_canceled ^ 1);
}

Assistant:

bool create_clusters(
            const weighted_vec_array& weighted_vecs,
            uint max_clusters, crnlib::vector<crnlib::vector<uint> >& cluster_indices,
            progress_callback_func pProgress_callback,
            void* pProgress_callback_data)
        {
            m_main_thread_id = crn_get_current_thread_id();
            m_canceled = false;
            m_pProgress_callback = pProgress_callback;
            m_pProgress_callback_data = pProgress_callback_data;

            if (max_clusters >= 128)
            {
                crnlib::vector<uint> primary_indices(weighted_vecs.size());
                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    primary_indices[i] = i;
                }

                CRNLIB_ASSUME(cMaxClusterizers == 4);

                crnlib::vector<uint> indices[6];

                compute_split(weighted_vecs, primary_indices, indices[0], indices[1]);
                compute_split(weighted_vecs, indices[0], indices[2], indices[3]);
                compute_split(weighted_vecs, indices[1], indices[4], indices[5]);

                create_clusters_task_state task_state[4];

                m_cluster_task_displayed_progress = false;

                uint total_partitions = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (num_indices)
                    {
                        total_partitions++;
                    }
                }

                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (!num_indices)
                    {
                        continue;
                    }

                    task_state[i].m_pWeighted_vecs = &weighted_vecs;
                    task_state[i].m_pIndices = &indices[2 + i];
                    task_state[i].m_max_clusters = (max_clusters + (total_partitions / 2)) / total_partitions;

                    m_pTask_pool->queue_object_task(this, &threaded_clusterizer::create_clusters_task, i, &task_state[i]);
                }

                m_pTask_pool->join();

                if (m_canceled)
                {
                    return false;
                }

                uint total_clusters = 0;
                for (uint i = 0; i < 4; i++)
                {
                    total_clusters += task_state[i].m_cluster_indices.size();
                }

                cluster_indices.reserve(total_clusters);
                cluster_indices.resize(0);

                for (uint i = 0; i < 4; i++)
                {
                    const uint ofs = cluster_indices.size();

                    cluster_indices.resize(ofs + task_state[i].m_cluster_indices.size());

                    for (uint j = 0; j < task_state[i].m_cluster_indices.size(); j++)
                    {
                        cluster_indices[ofs + j].swap(task_state[i].m_cluster_indices[j]);
                    }
                }
            }
            else
            {
                m_clusterizers[0].clear();
                m_clusterizers[0].get_training_vecs().reserve(weighted_vecs.size());

                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    const weighted_vec& v = weighted_vecs[i];

                    m_clusterizers[0].add_training_vec(v.m_vec, v.m_weight);
                }

                m_clusterizers[0].generate_codebook(max_clusters, generate_codebook_progress_callback, this, false);  //m_params.m_dxt_quality <= cCRNDXTQualityFast);

                const uint num_clusters = m_clusterizers[0].get_codebook_size();

                m_clusterizers[0].retrieve_clusters(num_clusters, cluster_indices);
            }

            return !m_canceled;
        }